

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O2

void anon_unknown.dwarf_12ce01::testWriteRead(int partNumber)

{
  uint uVar1;
  char *fileName;
  Header *headers;
  bool bVar2;
  __type _Var3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  LineOrder LVar8;
  int iVar9;
  int iVar10;
  ostream *poVar11;
  ChannelList *pCVar12;
  undefined1 *type;
  LineOrder *pLVar13;
  ulong extraout_RAX;
  ulong uVar14;
  string *psVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 *type_00;
  uint *puVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  int local_340;
  ulong local_338;
  int local_328;
  DeepScanLineOutputPart part_1;
  Array2D<unsigned_int> sampleCount;
  Header header;
  MultiPartOutputFile file;
  Array2D<unsigned_int_*> deepUintData;
  Array2D<float_*> deepFloatData;
  Array2D<half_*> deepHalfData;
  Array2D<unsigned_int> uintData;
  Array2D<float> floatData;
  Array2D<half> halfData;
  vector<Imf_2_5::GenericOutputFile_*,_std::allocator<Imf_2_5::GenericOutputFile_*>_> outputfiles;
  stringstream ss;
  float fStack_1b4;
  _Rb_tree_node_base local_1b0;
  size_t local_190;
  
  uVar17 = (ulong)(uint)partNumber;
  poVar11 = std::operator<<((ostream *)&std::cout,"Testing file with ");
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,partNumber);
  poVar11 = std::operator<<(poVar11," part(s).");
  std::endl<char,std::char_traits<char>>(poVar11);
  std::ostream::flush();
  uVar18 = uVar17;
  if (partNumber < 1) {
    uVar18 = 0;
  }
  halfData._sizeX = 0;
  halfData._sizeY = 0;
  halfData._data = (half *)0x0;
  floatData._sizeX = 0;
  floatData._sizeY = 0;
  floatData._data = (float *)0x0;
  uintData._sizeX = 0;
  uintData._sizeY = 0;
  uintData._data = (uint *)0x0;
  sampleCount._sizeX = 0;
  sampleCount._sizeY = 0;
  sampleCount._data = (uint *)0x0;
  deepHalfData._sizeX = 0;
  deepHalfData._sizeY = 0;
  deepHalfData._data = (half **)0x0;
  deepFloatData._sizeX = 0;
  deepFloatData._sizeY = 0;
  deepFloatData._data = (float **)0x0;
  deepUintData._sizeX = 0;
  deepUintData._sizeY = 0;
  deepUintData._data = (uint **)0x0;
  outputfiles.
  super__Vector_base<Imf_2_5::GenericOutputFile_*,_std::allocator<Imf_2_5::GenericOutputFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputfiles.
  super__Vector_base<Imf_2_5::GenericOutputFile_*,_std::allocator<Imf_2_5::GenericOutputFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputfiles.
  super__Vector_base<Imf_2_5::GenericOutputFile_*,_std::allocator<Imf_2_5::GenericOutputFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::pixelTypes,uVar17);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::partTypes,uVar17);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::levelModes,uVar17);
  poVar11 = std::operator<<((ostream *)&std::cout,"Generating headers and data");
  std::endl<char,std::char_traits<char>>(poVar11);
  std::ostream::flush();
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::clear
            ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
             &(anonymous_namespace)::headers);
  local_328 = 0;
  lVar16 = 0;
  do {
    if (uVar18 * 4 - lVar16 == 0) {
      remove((anonymous_namespace)::filename_abi_cxx11_);
      lVar16 = DAT_00423878;
      headers = (anonymous_namespace)::headers;
      fileName = (anonymous_namespace)::filename_abi_cxx11_;
      iVar4 = Imf_2_5::globalThreadCount();
      Imf_2_5::MultiPartOutputFile::MultiPartOutputFile
                (&file,fileName,headers,(int)((lVar16 - (long)headers) / 0x38),false,iVar4);
      std::operator<<((ostream *)&std::cout,"Writing files ");
      std::ostream::flush();
      for (local_338 = 0; local_338 != uVar18; local_338 = local_338 + 1) {
        iVar4 = (int)local_338;
        switch(*(undefined4 *)((anonymous_namespace)::partTypes + local_338 * 4)) {
        case 0:
          Imf_2_5::OutputPart::OutputPart((OutputPart *)&header,&file,iVar4);
          local_1b0._M_color = _S_red;
          local_1b0._M_parent = (_Base_ptr)0x0;
          local_1b0._M_left = &local_1b0;
          local_190 = 0;
          local_1b0._M_right = local_1b0._M_left;
          fillPixels<unsigned_int>(&uintData,0x10,0x10);
          fillPixels<float>(&floatData,0x10,0x10);
          fillPixels<half>(&halfData,0x10,0x10);
          setOutputFrameBuffer
                    ((FrameBuffer *)&ss,*(int *)((anonymous_namespace)::pixelTypes + local_338 * 4),
                     &uintData,&floatData,&halfData,0x10);
          Imf_2_5::OutputPart::setFrameBuffer((OutputPart *)&header,(FrameBuffer *)&ss);
          Imf_2_5::OutputPart::writePixels((OutputPart *)&header,0x10);
          std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                       *)&ss);
          break;
        case 1:
          Imf_2_5::TiledOutputPart::TiledOutputPart((TiledOutputPart *)&header,&file,iVar4);
          iVar4 = Imf_2_5::TiledOutputPart::numXLevels((TiledOutputPart *)&header);
          iVar6 = Imf_2_5::TiledOutputPart::numYLevels((TiledOutputPart *)&header);
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          local_340 = 0;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          for (; local_340 != iVar4; local_340 = local_340 + 1) {
            for (iVar7 = 0; iVar6 != iVar7; iVar7 = iVar7 + 1) {
              bVar2 = Imf_2_5::TiledOutputPart::isValidLevel
                                ((TiledOutputPart *)&header,local_340,iVar7);
              if (bVar2) {
                iVar10 = Imf_2_5::TiledOutputPart::levelWidth((TiledOutputPart *)&header,local_340);
                iVar9 = Imf_2_5::TiledOutputPart::levelHeight((TiledOutputPart *)&header,iVar7);
                local_1b0._M_color = _S_red;
                local_1b0._M_parent = (_Base_ptr)0x0;
                local_1b0._M_left = &local_1b0;
                local_190 = 0;
                local_1b0._M_right = local_1b0._M_left;
                fillPixels<unsigned_int>(&uintData,iVar10,iVar9);
                fillPixels<float>(&floatData,iVar10,iVar9);
                fillPixels<half>(&halfData,iVar10,iVar9);
                setOutputFrameBuffer
                          ((FrameBuffer *)&ss,
                           *(int *)((anonymous_namespace)::pixelTypes + local_338 * 4),&uintData,
                           &floatData,&halfData,iVar10);
                Imf_2_5::TiledOutputPart::setFrameBuffer
                          ((TiledOutputPart *)&header,(FrameBuffer *)&ss);
                iVar10 = Imf_2_5::TiledOutputPart::numXTiles((TiledOutputPart *)&header,local_340);
                iVar9 = Imf_2_5::TiledOutputPart::numYTiles((TiledOutputPart *)&header,iVar7);
                Imf_2_5::TiledOutputPart::writeTiles
                          ((TiledOutputPart *)&header,0,iVar10 + -1,0,iVar9 + -1,local_340,iVar7);
                std::
                _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                             *)&ss);
              }
            }
          }
          break;
        case 2:
          Imf_2_5::DeepScanLineOutputPart::DeepScanLineOutputPart(&part_1,&file,iVar4);
          Imf_2_5::DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)&ss);
          Imf_2_5::Array2D<unsigned_int>::resizeErase(&sampleCount,0x10,0x10);
          uVar14 = 0;
          iVar4 = 1;
          uVar17 = extraout_RAX;
          puVar19 = sampleCount._data;
          for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
            iVar7 = (int)uVar14;
            lVar22 = 0;
            iVar6 = iVar4;
            while( true ) {
              uVar17 = uVar14 / 10;
              if (lVar22 == 0x10) break;
              puVar19[lVar22] = iVar6 + (int)uVar17 * -10;
              lVar22 = lVar22 + 1;
              iVar6 = iVar6 + 1;
              uVar14 = (ulong)((int)uVar14 + 1);
            }
            iVar4 = iVar4 + 0x10;
            uVar14 = (ulong)(iVar7 + 0x10);
            puVar19 = puVar19 + sampleCount._sizeY;
          }
          Imf_2_5::Slice::Slice
                    ((Slice *)&header,UINT,(char *)sampleCount._data,4,0x40,1,1,0.0,SUB41(iVar4,0),
                     SUB81(uVar17,0));
          Imf_2_5::DeepFrameBuffer::insertSampleCountSlice((DeepFrameBuffer *)&ss,(Slice *)&header);
          iVar4 = *(int *)((anonymous_namespace)::pixelTypes + local_338 * 4);
          if (iVar4 == 0) {
            fillPixels<unsigned_int>(&sampleCount,&deepUintData,0x10,0x10);
            iVar4 = *(int *)((anonymous_namespace)::pixelTypes + local_338 * 4);
          }
          if (iVar4 == 1) {
            fillPixels<float>(&sampleCount,&deepFloatData,0x10,0x10);
            iVar4 = *(int *)((anonymous_namespace)::pixelTypes + local_338 * 4);
          }
          if (iVar4 == 2) {
            fillPixels<half>(&sampleCount,&deepHalfData,0x10,0x10);
            iVar4 = *(int *)((anonymous_namespace)::pixelTypes + local_338 * 4);
          }
          setOutputDeepFrameBuffer
                    ((DeepFrameBuffer *)&ss,iVar4,&deepUintData,&deepFloatData,&deepHalfData,0x10);
          Imf_2_5::DeepScanLineOutputPart::setFrameBuffer(&part_1,(DeepFrameBuffer *)&ss);
          Imf_2_5::DeepScanLineOutputPart::writePixels(&part_1,0x10);
          releasePixels(*(int *)((anonymous_namespace)::pixelTypes + local_338 * 4),&deepUintData,
                        &deepFloatData,&deepHalfData,0x10,0x10);
          std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                       *)&ss);
          break;
        case 3:
          Imf_2_5::DeepTiledOutputPart::DeepTiledOutputPart
                    ((DeepTiledOutputPart *)&part_1,&file,iVar4);
          iVar4 = Imf_2_5::DeepTiledOutputPart::numXLevels((DeepTiledOutputPart *)&part_1);
          iVar6 = Imf_2_5::DeepTiledOutputPart::numYLevels((DeepTiledOutputPart *)&part_1);
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          local_328 = 0;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          for (; local_328 != iVar4; local_328 = local_328 + 1) {
            for (iVar7 = 0; iVar7 != iVar6; iVar7 = iVar7 + 1) {
              bVar2 = Imf_2_5::DeepTiledOutputPart::isValidLevel
                                ((DeepTiledOutputPart *)&part_1,local_328,iVar7);
              if (bVar2) {
                uVar5 = Imf_2_5::DeepTiledOutputPart::levelWidth
                                  ((DeepTiledOutputPart *)&part_1,local_328);
                uVar21 = Imf_2_5::DeepTiledOutputPart::levelHeight
                                   ((DeepTiledOutputPart *)&part_1,iVar7);
                Imf_2_5::DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)&ss);
                Imf_2_5::Array2D<unsigned_int>::resizeErase
                          (&sampleCount,(long)(int)uVar21,(long)(int)uVar5);
                uVar17 = 0;
                if (0 < (int)uVar5) {
                  uVar17 = (ulong)uVar5;
                }
                uVar14 = 0;
                uVar1 = uVar21;
                if ((int)uVar21 < 1) {
                  uVar1 = 0;
                }
                iVar10 = 0;
                lVar16 = 0;
                for (uVar20 = 0; uVar20 != uVar1; uVar20 = uVar20 + 1) {
                  for (uVar23 = 0; uVar17 != uVar23; uVar23 = uVar23 + 1) {
                    iVar9 = iVar10 + (int)uVar23;
                    uVar14 = (long)iVar9 / 10 & 0xffffffff;
                    *(int *)((long)sampleCount._data + uVar23 * 4 + sampleCount._sizeY * lVar16) =
                         iVar9 % 10 + 1;
                  }
                  lVar16 = lVar16 + 4;
                  iVar10 = iVar10 + uVar5;
                }
                Imf_2_5::Slice::Slice
                          ((Slice *)&header,UINT,(char *)sampleCount._data,4,(long)(int)uVar5 << 2,1
                           ,1,0.0,SUB81(uVar20,0),SUB81(uVar14,0));
                Imf_2_5::DeepFrameBuffer::insertSampleCountSlice
                          ((DeepFrameBuffer *)&ss,(Slice *)&header);
                iVar10 = *(int *)((anonymous_namespace)::pixelTypes + local_338 * 4);
                if (iVar10 == 0) {
                  fillPixels<unsigned_int>(&sampleCount,&deepUintData,uVar5,uVar21);
                  iVar10 = *(int *)((anonymous_namespace)::pixelTypes + local_338 * 4);
                }
                if (iVar10 == 1) {
                  fillPixels<float>(&sampleCount,&deepFloatData,uVar5,uVar21);
                  iVar10 = *(int *)((anonymous_namespace)::pixelTypes + local_338 * 4);
                }
                if (iVar10 == 2) {
                  fillPixels<half>(&sampleCount,&deepHalfData,uVar5,uVar21);
                  iVar10 = *(int *)((anonymous_namespace)::pixelTypes + local_338 * 4);
                }
                setOutputDeepFrameBuffer
                          ((DeepFrameBuffer *)&ss,iVar10,&deepUintData,&deepFloatData,&deepHalfData,
                           uVar5);
                Imf_2_5::DeepTiledOutputPart::setFrameBuffer
                          ((DeepTiledOutputPart *)&part_1,(DeepFrameBuffer *)&ss);
                iVar10 = Imf_2_5::DeepTiledOutputPart::numXTiles
                                   ((DeepTiledOutputPart *)&part_1,local_328);
                iVar9 = Imf_2_5::DeepTiledOutputPart::numYTiles
                                  ((DeepTiledOutputPart *)&part_1,iVar7);
                Imf_2_5::DeepTiledOutputPart::writeTiles
                          ((DeepTiledOutputPart *)&part_1,0,iVar10 + -1,0,iVar9 + -1,local_328,iVar7
                          );
                releasePixels(*(int *)((anonymous_namespace)::pixelTypes + local_338 * 4),
                              &deepUintData,&deepFloatData,&deepHalfData,uVar5,uVar21);
                std::
                _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                             *)&ss);
              }
            }
          }
        }
      }
      Imf_2_5::MultiPartOutputFile::~MultiPartOutputFile(&file);
      std::_Vector_base<Imf_2_5::GenericOutputFile_*,_std::allocator<Imf_2_5::GenericOutputFile_*>_>
      ::~_Vector_base(&outputfiles.
                       super__Vector_base<Imf_2_5::GenericOutputFile_*,_std::allocator<Imf_2_5::GenericOutputFile_*>_>
                     );
      Imf_2_5::Array2D<unsigned_int_*>::~Array2D(&deepUintData);
      Imf_2_5::Array2D<float_*>::~Array2D(&deepFloatData);
      Imf_2_5::Array2D<half_*>::~Array2D(&deepHalfData);
      Imf_2_5::Array2D<unsigned_int>::~Array2D(&sampleCount);
      Imf_2_5::Array2D<unsigned_int>::~Array2D(&uintData);
      Imf_2_5::Array2D<float>::~Array2D(&floatData);
      Imf_2_5::Array2D<half>::~Array2D(&halfData);
      readFirstPart();
      readWholeFiles(0);
      psVar15 = Imf_2_5::Header::type_abi_cxx11_((anonymous_namespace)::headers);
      _Var3 = std::operator==(psVar15,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)Imf_2_5::DEEPSCANLINE_abi_cxx11_);
      if (!_Var3) {
        psVar15 = Imf_2_5::Header::type_abi_cxx11_((anonymous_namespace)::headers);
        _Var3 = std::operator==(psVar15,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)Imf_2_5::DEEPTILE_abi_cxx11_);
        if (!_Var3) {
          modifyType(false);
          readFirstPart();
          std::operator<<((ostream *)&std::cerr," part reading succeeded but should have failed\n");
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                        ,0x54d,"void (anonymous namespace)::testWriteRead(int)");
        }
      }
      modifyType(true);
      readFirstPart();
      std::operator<<((ostream *)&std::cerr," part reading succeeded but should have failed\n");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x53a,"void (anonymous namespace)::testWriteRead(int)");
    }
    _ss = 0.0;
    fStack_1b4 = 0.0;
    Imf_2_5::Header::Header(&header,0x10,0x10,1.0,(V2f *)&ss,1.0,INCREASING_Y,ZIPS_COMPRESSION);
    iVar4 = random_int(3);
    uVar5 = random_int(4);
    *(int *)((anonymous_namespace)::pixelTypes + lVar16) = iVar4;
    *(uint *)((anonymous_namespace)::partTypes + lVar16) = uVar5;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::operator<<(&local_1b0._M_parent,local_328);
    std::__cxx11::stringbuf::str();
    Imf_2_5::Header::setName(&header,(string *)&file);
    std::__cxx11::string::~string((string *)&file);
    if (iVar4 == 0) {
      pCVar12 = Imf_2_5::Header::channels(&header);
      Imf_2_5::Channel::Channel((Channel *)&file,UINT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"UINT",(Channel *)&file);
    }
    else if (iVar4 == 1) {
      pCVar12 = Imf_2_5::Header::channels(&header);
      Imf_2_5::Channel::Channel((Channel *)&file,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"FLOAT",(Channel *)&file);
    }
    else if (iVar4 == 2) {
      pCVar12 = Imf_2_5::Header::channels(&header);
      Imf_2_5::Channel::Channel((Channel *)&file,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"HALF",(Channel *)&file);
    }
    type_00 = Imf_2_5::SCANLINEIMAGE_abi_cxx11_;
    type = Imf_2_5::TILEDIMAGE_abi_cxx11_;
    switch(uVar5) {
    case 2:
      type_00 = Imf_2_5::DEEPSCANLINE_abi_cxx11_;
    case 0:
      Imf_2_5::Header::setType(&header,(string *)type_00);
      uVar21 = uVar5 & 0xfffffffd;
      break;
    case 3:
      type = Imf_2_5::DEEPTILE_abi_cxx11_;
    case 1:
      Imf_2_5::Header::setType(&header,(string *)type);
      uVar1 = uVar5 & 0xfffffffd;
LAB_0014e349:
      uVar21 = uVar1;
      iVar6 = random_int(0x10);
      iVar7 = random_int(0x10);
      file._data._0_4_ = random_int(3);
      file.super_GenericOutputFile._vptr_GenericOutputFile._0_4_ = iVar6 + 1;
      file.super_GenericOutputFile._vptr_GenericOutputFile._4_4_ = iVar7 + 1;
      *(uint *)((anonymous_namespace)::levelModes + lVar16) = (uint)file._data;
      if (2 < (uint)file._data) {
        file._data._0_4_ = 3;
      }
      file._data._4_4_ = 0;
      Imf_2_5::Header::setTileDescription(&header,(TileDescription *)&file);
      break;
    default:
      uVar21 = uVar5 & 0xfffffffd;
      uVar1 = 1;
      if (uVar21 == 1) goto LAB_0014e349;
    }
    LVar8 = random_int(3);
    if (uVar21 == 0) {
      LVar8 = random_int(2);
    }
    pLVar13 = Imf_2_5::Header::lineOrder(&header);
    if (RANDOM_Y < LVar8) {
      LVar8 = NUM_LINEORDERS;
    }
    *pLVar13 = LVar8;
    if (uVar21 == 0) {
      poVar11 = std::operator<<((ostream *)&std::cout,"pixelType = ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar4);
      poVar11 = std::operator<<(poVar11," partType = ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar5);
      poVar11 = std::operator<<(poVar11," line order =");
      pLVar13 = Imf_2_5::Header::lineOrder(&header);
    }
    else {
      poVar11 = std::operator<<((ostream *)&std::cout,"pixelType = ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar4);
      poVar11 = std::operator<<(poVar11," partType = ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar5);
      poVar11 = std::operator<<(poVar11," tile order =");
      pLVar13 = Imf_2_5::Header::lineOrder(&header);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pLVar13);
      poVar11 = std::operator<<(poVar11," levelMode = ");
      pLVar13 = (LineOrder *)((anonymous_namespace)::levelModes + lVar16);
    }
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pLVar13);
    std::endl<char,std::char_traits<char>>(poVar11);
    std::ostream::flush();
    iVar4 = Imf_2_5::getChunkOffsetTableSize(&header,true);
    Imf_2_5::Header::setChunkCount(&header,iVar4);
    std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
              ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
               &(anonymous_namespace)::headers,&header);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    Imf_2_5::Header::~Header(&header);
    lVar16 = lVar16 + 4;
    local_328 = local_328 + 1;
  } while( true );
}

Assistant:

void
testWriteRead (int partNumber)
{
    cout << "Testing file with " << partNumber << " part(s)." << endl << flush;

    for(int i=0;i<40;i++)
    {
        generateRandomFile(partNumber);

        try
        {
            readFirstPart();
        }
        catch(std::exception & e)
        {
            cerr << " part reading failed with " << e.what() << " but should have succeeded\n";
            assert(false);
        }
        
        
        readWholeFiles(0);
        
        
        bool caught = false;

        // for deep images, check that "version 2" files don't load
        if(headers[0].type()==DEEPSCANLINE || headers[0].type()==DEEPTILE)
        {
            modifyType(true);
            try
            {
                caught = false;
                readFirstPart();
                cerr << " part reading succeeded but should have failed\n";
                assert(false);
            }
            catch(std::exception & e)
            {
                cout << "recieved exception (" << e.what() << ") as expected\n";
                caught = true;
                // that's what we thought would happen
            }
            assert (caught);
            readWholeFiles(2);
        }
        
        modifyType(false);
        
        try
        {
            caught = false;
            readFirstPart();
            cerr << " part reading succeeded but should have failed\n";
            assert(false);
        }
        catch(std::exception & e)
        {
            cout << "recieved exception (" << e.what() << ") as expected\n";
            caught = true;
            // that's what we thought would happen
        }
        assert (caught);
        
        // this should always succeed: it doesn't try to read the strange new type in part 0
        readWholeFiles(1);
        
        remove (filename.c_str());
        cout << endl << flush;
    }
    
}